

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createMaterial_matte(SemanticParser *this,SP *in)

{
  bool bVar1;
  element_type *peVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamSet *in_RSI;
  element_type *in_RDI;
  SP SVar3;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  SP mat;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffe58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  float in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  element_type *name_00;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 uVar4;
  SP *in_stack_fffffffffffffeb0;
  SemanticParser *in_stack_fffffffffffffeb8;
  string local_130 [44];
  float in_stack_fffffffffffffefc;
  string *in_stack_ffffffffffffff00;
  ParamSet *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff38;
  float *in_stack_ffffffffffffff40;
  ParamSet *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  string local_a0 [48];
  string local_70 [48];
  _Self local_40;
  _Self local_38;
  element_type *local_30;
  
  name_00 = in_RDI;
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1b2ecb);
  std::make_shared<pbrt::MatteMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  local_30 = std::
             __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b2ee9);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                *)in_stack_fffffffffffffe58);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
              *)in_stack_fffffffffffffe58);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      std::shared_ptr<pbrt::Material>::shared_ptr<pbrt::MatteMaterial,void>
                ((shared_ptr<pbrt::Material> *)in_stack_fffffffffffffe60,
                 (shared_ptr<pbrt::MatteMaterial> *)in_stack_fffffffffffffe58);
      std::shared_ptr<pbrt::MatteMaterial>::~shared_ptr((shared_ptr<pbrt::MatteMaterial> *)0x1b34ad)
      ;
      SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = name_00;
      return (SP)SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x1b2f46);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::string(local_a0,local_70);
    bVar1 = std::operator==(&in_stack_fffffffffffffe60->first,(char *)in_stack_fffffffffffffe58);
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b2fa0);
      bVar1 = syntactic::ParamSet::hasParamTexture
                        ((ParamSet *)
                         CONCAT17(in_stack_fffffffffffffe77,
                                  CONCAT16(in_stack_fffffffffffffe76,
                                           CONCAT24(in_stack_fffffffffffffe74,
                                                    in_stack_fffffffffffffe70))),
                         (string *)
                         CONCAT17(in_stack_fffffffffffffe6f,
                                  CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
      if (bVar1) {
        math::vec3f::vec3f((vec3f *)&stack0xffffffffffffff54,1.0);
        peVar2 = std::
                 __shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b2fe7);
        (peVar2->kd).z = in_stack_ffffffffffffff5c;
        (peVar2->kd).x = in_stack_ffffffffffffff54;
        (peVar2->kd).y = in_stack_ffffffffffffff58;
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3007);
        syntactic::ParamSet::getParamTexture
                  ((ParamSet *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        findOrCreateTexture(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        std::__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b304a);
        std::shared_ptr<pbrt::Texture>::operator=
                  ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe60,
                   (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe58);
        std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b306b);
        std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                  ((shared_ptr<pbrt::syntactic::Texture> *)0x1b3078);
      }
      else {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b30f8);
        std::__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b310a);
        syntactic::ParamSet::getParam3f
                  (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
    }
    else {
      in_stack_fffffffffffffe77 =
           std::operator==(&in_stack_fffffffffffffe60->first,(char *)in_stack_fffffffffffffe58);
      if ((bool)in_stack_fffffffffffffe77) {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b315d);
        in_stack_fffffffffffffe76 = syntactic::ParamSet::hasParam1f(in_RSI,(string *)name_00);
        if ((bool)in_stack_fffffffffffffe76) {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b3187);
          in_stack_fffffffffffffe70 =
               syntactic::ParamSet::getParam1f
                         (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffefc);
          peVar2 = std::
                   __shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1b31af);
          peVar2->sigma = in_stack_fffffffffffffe70;
        }
        else {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b31c9);
          syntactic::ParamSet::getParamTexture
                    ((ParamSet *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          findOrCreateTexture(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          std::__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b320c);
          std::shared_ptr<pbrt::Texture>::operator=
                    ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe60,
                     (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe58);
          std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b322d);
          std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                    ((shared_ptr<pbrt::syntactic::Texture> *)0x1b323a);
        }
      }
      else {
        in_stack_fffffffffffffe6f =
             std::operator==(&in_stack_fffffffffffffe60->first,(char *)in_stack_fffffffffffffe58);
        if (!(bool)in_stack_fffffffffffffe6f) {
          in_stack_fffffffffffffe6e =
               std::operator==(&in_stack_fffffffffffffe60->first,(char *)in_stack_fffffffffffffe58);
          if (!(bool)in_stack_fffffffffffffe6e) {
            uVar4 = 1;
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((char *)CONCAT17(uVar4,in_stack_fffffffffffffea8),in_RDX);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe6f,
                                    CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
                           (char *)this_00);
            std::runtime_error::runtime_error(this_00,local_130);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b32c1);
          syntactic::ParamSet::getParamTexture
                    ((ParamSet *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          findOrCreateTexture(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          std::__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b3304);
          std::shared_ptr<pbrt::Texture>::operator=
                    ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe60,
                     (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe58);
          std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b3325);
          std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                    ((shared_ptr<pbrt::syntactic::Texture> *)0x1b3332);
        }
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(in_stack_fffffffffffffe60);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)in_stack_fffffffffffffe60);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_matte(pbrt::syntactic::Material::SP in)
  {
    MatteMaterial::SP mat = std::make_shared<MatteMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kd") {
        if (in->hasParamTexture(name)) {
          mat->kd = vec3f(1.f);
          mat->map_kd = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kd.x,name);
      }
      else if (name == "sigma") {
        if (in->hasParam1f(name))
          mat->sigma = in->getParam1f(name);
        else 
          mat->map_sigma = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      } else
        throw std::runtime_error("un-handled matte-material parameter '"+it.first+"'");
    };
    return mat;
  }